

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  uint64_t *puVar5;
  uhugeint_t uVar6;
  uhugeint_t left;
  uhugeint_t right;
  uhugeint_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    puVar5 = &result_data->upper;
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar2 = iVar3;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)lsel->sel_vector[iVar3];
      }
      iVar4 = iVar3;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)rsel->sel_vector[iVar3];
      }
      left.upper = ldata[iVar2].upper;
      left.lower = ldata[iVar2].lower;
      right.upper = rdata[iVar4].upper;
      right.lower = rdata[iVar4].lower;
      uVar6 = BinaryZeroIsNullWrapper::
              Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (fun,left,right,result_validity,iVar3);
      ((uhugeint_t *)(puVar5 + -1))->lower = uVar6.lower;
      *puVar5 = uVar6.upper;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    puVar5 = &result_data->upper;
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar2 = iVar3;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)lsel->sel_vector[iVar3];
      }
      iVar4 = iVar3;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)rsel->sel_vector[iVar3];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,iVar2);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,iVar4);
        if (!bVar1) goto LAB_0151acde;
        uVar6.upper = ldata[iVar2].upper;
        uVar6.lower = ldata[iVar2].lower;
        right_00.upper = rdata[iVar4].upper;
        right_00.lower = rdata[iVar4].lower;
        uVar6 = BinaryZeroIsNullWrapper::
                Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                          (fun,uVar6,right_00,result_validity,iVar3);
        ((uhugeint_t *)(puVar5 + -1))->lower = uVar6.lower;
        *puVar5 = uVar6.upper;
      }
      else {
LAB_0151acde:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,iVar3);
      }
      puVar5 = puVar5 + 2;
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}